

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BplusTree.hpp
# Opt level: O0

bool __thiscall
sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::insert
          (BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_> *this,
          value_type *value)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  bool bVar4;
  ulong uVar5;
  undefined8 uVar6;
  long lVar7;
  unsigned_long_long *in_RSI;
  int *in_RDI;
  undefined1 auVar8 [16];
  node *y;
  pair<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node_*,_long>
  lnk_1;
  unsigned_long_long tmpk [100];
  uint tmpv [100];
  node **x;
  int *pp;
  node **p;
  locType *pos;
  node *x_1;
  pair<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node_*,_long>
  lnk;
  int j;
  int i;
  uint vt;
  unsigned_long_long vkey;
  unsigned_long_long in_stack_fffffffffffffa70;
  unsigned_long_long in_stack_fffffffffffffa78;
  BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>
  *in_stack_fffffffffffffa80;
  byte local_553;
  byte local_552;
  bool local_551;
  undefined8 local_530;
  unsigned_long_long auStack_528 [100];
  undefined4 auStack_208 [102];
  long *local_70;
  less<unsigned_long_long> local_63;
  less<unsigned_long_long> local_62;
  less<unsigned_long_long> local_61;
  void *local_60;
  void *local_58;
  undefined8 *local_50;
  undefined4 *local_48;
  undefined4 *local_40;
  undefined8 local_38;
  int local_2c;
  int local_28;
  undefined4 local_24;
  unsigned_long_long local_20 [3];
  bool local_1;
  
  local_20[0] = *in_RSI;
  local_24 = (undefined4)in_RSI[1];
  if (*in_RDI == 0) {
    auVar8 = (**(code **)(**(long **)(in_RDI + 4) + 8))();
    local_38 = auVar8._8_8_;
    local_48 = auVar8._0_8_;
    *(undefined8 *)(in_RDI + 2) = local_38;
    *in_RDI = 1;
    local_48[400] = 1;
    *(unsigned_long_long *)(local_48 + 0xca) = local_20[0];
    *local_48 = local_24;
    *(undefined8 *)(local_48 + 200) = 0xffffffffffffffff;
    local_40 = local_48;
    (**(code **)(**(long **)(in_RDI + 4) + 0x18))(*(long **)(in_RDI + 4),in_RDI + 2);
    in_RDI[1] = 1;
    local_1 = true;
  }
  else {
    auVar8._8_8_ = 0;
    auVar8._0_8_ = (long)*in_RDI;
    uVar5 = SUB168(auVar8 * ZEXT816(8),0);
    if (SUB168(auVar8 * ZEXT816(8),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    local_50 = (undefined8 *)operator_new__(uVar5);
    memset(local_50,0,8);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)*in_RDI;
    uVar5 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    local_58 = operator_new__(uVar5);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)*in_RDI;
    uVar5 = SUB168(auVar2 * ZEXT816(4),0);
    if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    local_60 = operator_new__(uVar5);
    *local_50 = *(undefined8 *)(in_RDI + 2);
    for (local_28 = 0; local_28 < *in_RDI; local_28 = local_28 + 1) {
      uVar6 = (**(code **)(**(long **)(in_RDI + 4) + 0x10))
                        (*(long **)(in_RDI + 4),local_50 + local_28);
      *(undefined8 *)((long)local_58 + (long)local_28 * 8) = uVar6;
      local_2c = 0;
      while( true ) {
        local_551 = false;
        if (local_2c < *(int *)(*(long *)((long)local_58 + (long)local_28 * 8) + 0x640)) {
          local_551 = std::less<unsigned_long_long>::operator()
                                (&local_61,
                                 (unsigned_long_long *)
                                 (*(long *)((long)local_58 + (long)local_28 * 8) + 0x328 +
                                 (long)local_2c * 8),local_20);
        }
        if (local_551 == false) break;
        local_2c = local_2c + 1;
      }
      if (local_28 < *in_RDI + -1) {
        local_552 = 0;
        if (local_2c < *(int *)(*(long *)((long)local_58 + (long)local_28 * 8) + 0x640)) {
          bVar4 = std::less<unsigned_long_long>::operator()
                            (&local_62,local_20,
                             (unsigned_long_long *)
                             (*(long *)((long)local_58 + (long)local_28 * 8) + 0x328 +
                             (long)local_2c * 8));
          local_552 = bVar4 ^ 0xff;
        }
        if ((local_552 & 1) != 0) {
          local_2c = local_2c + 1;
        }
        local_50[local_28 + 1] =
             *(undefined8 *)(*(long *)((long)local_58 + (long)local_28 * 8) + (long)local_2c * 8);
      }
      *(int *)((long)local_60 + (long)local_28 * 4) = local_2c;
    }
    local_553 = 0;
    if (local_2c < *(int *)(*(long *)((long)local_58 + (long)(*in_RDI + -1) * 8) + 0x640)) {
      bVar4 = std::less<unsigned_long_long>::operator()
                        (&local_63,local_20,
                         (unsigned_long_long *)
                         (*(long *)((long)local_58 + (long)(*in_RDI + -1) * 8) + 0x328 +
                         (long)local_2c * 8));
      local_553 = bVar4 ^ 0xff;
    }
    if ((local_553 & 1) == 0) {
      local_70 = (long *)((long)local_58 + (long)(*in_RDI + -1) * 8);
      if (local_2c == 0) {
        for (local_28 = *in_RDI + -2; -1 < local_28; local_28 = local_28 + -1) {
          if ((*(int *)((long)local_60 + (long)local_28 * 4) != 0) &&
             (bVar4 = equal(in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
                            in_stack_fffffffffffffa70), bVar4)) {
            *(unsigned_long_long *)
             (*(long *)((long)local_58 + (long)local_28 * 8) + 0x328 +
             (long)(*(int *)((long)local_60 + (long)local_28 * 4) + -1) * 8) = local_20[0];
            (**(code **)(**(long **)(in_RDI + 4) + 0x18))
                      (*(long **)(in_RDI + 4),local_50 + local_28);
            break;
          }
        }
      }
      if (*(int *)(*local_70 + 0x640) < 99) {
        for (local_28 = *(int *)(*local_70 + 0x640); local_2c < local_28; local_28 = local_28 + -1)
        {
          *(undefined8 *)(*local_70 + 0x328 + (long)local_28 * 8) =
               *(undefined8 *)(*local_70 + 0x328 + (long)(local_28 + -1) * 8);
          *(undefined4 *)(*local_70 + (long)local_28 * 4) =
               *(undefined4 *)(*local_70 + (long)(local_28 + -1) * 4);
        }
        *(unsigned_long_long *)(*local_70 + 0x328 + (long)local_2c * 8) = local_20[0];
        *(undefined4 *)(*local_70 + (long)local_2c * 4) = local_24;
        *(int *)(*local_70 + 0x640) = *(int *)(*local_70 + 0x640) + 1;
        (**(code **)(**(long **)(in_RDI + 4) + 0x18))
                  (*(long **)(in_RDI + 4),local_50 + (*in_RDI + -1));
      }
      else {
        auVar8 = (**(code **)(**(long **)(in_RDI + 4) + 8))();
        local_530 = auVar8._8_8_;
        lVar7 = auVar8._0_8_;
        for (local_28 = 0; local_28 < local_2c; local_28 = local_28 + 1) {
          auStack_208[local_28] = *(undefined4 *)(*local_70 + (long)local_28 * 4);
          auStack_528[local_28] = *(unsigned_long_long *)(*local_70 + 0x328 + (long)local_28 * 8);
        }
        auStack_208[local_2c] = local_24;
        auStack_528[local_2c] = local_20[0];
        iVar3 = local_2c;
        while (local_28 = iVar3 + 1, local_28 < 100) {
          auStack_208[local_28] = *(undefined4 *)(*local_70 + (long)iVar3 * 4);
          auStack_528[local_28] =
               *(unsigned_long_long *)(*local_70 + 0x328 + (long)(local_28 + -1) * 8);
          iVar3 = local_28;
        }
        *(undefined8 *)(lVar7 + 800) = *(undefined8 *)(*local_70 + 800);
        *(undefined4 *)(*local_70 + 0x640) = 0x32;
        for (local_28 = 0; local_28 < *(int *)(*local_70 + 0x640); local_28 = local_28 + 1) {
          *(undefined4 *)(*local_70 + (long)local_28 * 4) = auStack_208[local_28];
          *(unsigned_long_long *)(*local_70 + 0x328 + (long)local_28 * 8) = auStack_528[local_28];
        }
        *(undefined8 *)(*local_70 + 800) = local_530;
        for (local_28 = *(int *)(*local_70 + 0x640); local_28 < 100; local_28 = local_28 + 1) {
          *(undefined4 *)(lVar7 + (long)(local_28 - *(int *)(*local_70 + 0x640)) * 4) =
               auStack_208[local_28];
          *(unsigned_long_long *)
           (lVar7 + 0x328 + (long)(local_28 - *(int *)(*local_70 + 0x640)) * 8) =
               auStack_528[local_28];
        }
        *(int *)(lVar7 + 0x640) = 100 - *(int *)(*local_70 + 0x640);
        (**(code **)(**(long **)(in_RDI + 4) + 0x18))(*(long **)(in_RDI + 4),&local_530);
        (**(code **)(**(long **)(in_RDI + 4) + 0x18))
                  (*(long **)(in_RDI + 4),local_50 + (*in_RDI + -1));
        insertnonleaf((BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>
                       *)tmpk[0x18],(unsigned_long_long *)tmpk[0x17],(int *)tmpk[0x16],
                      (node **)tmpk[0x15],(int *)tmpk[0x14],(locType *)tmpk[0x13],tmpk[0x1a]);
      }
      if (local_58 != (void *)0x0) {
        operator_delete__(local_58);
      }
      if (local_60 != (void *)0x0) {
        operator_delete__(local_60);
      }
      if (local_50 != (undefined8 *)0x0) {
        operator_delete__(local_50);
      }
      in_RDI[1] = in_RDI[1] + 1;
      local_1 = true;
    }
    else {
      if (local_58 != (void *)0x0) {
        operator_delete__(local_58);
      }
      if (local_60 != (void *)0x0) {
        operator_delete__(local_60);
      }
      if (local_50 != (undefined8 *)0x0) {
        operator_delete__(local_50);
      }
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool insert(const value_type &value) {
            Key vkey = value.first;
            T vt = value.second;
            int i, j;
            if (!depth) {
                auto lnk = file->newspace();
                node *x = lnk.first;
                root = lnk.second;
                depth = 1;
                x->sz = 1;
                x->keyvalue[0] = vkey;
                x->val[0] = vt;
                x->nxt = -1;
                file->save(root);
                siz=1;
                return 1;
            }
            locType *pos;
            node **p;
            int *pp;
            pos = new locType[depth];
            memset(pos, 0, sizeof pos);
            p = new node *[depth];
            pp = new int[depth];
            pos[0] = root;
            for (i = 0; i < depth; ++i) {
                p[i] = file->read(pos[i]);
                for (j = 0; j < p[i]->sz && Compare()(p[i]->keyvalue[j], vkey); ++j);
                if (i < depth - 1) {
                    if (j < p[i]->sz && !Compare()(vkey, p[i]->keyvalue[j]))++j;
                    pos[i + 1] = p[i]->pointer[j];
                }
                pp[i] = j;
            }
            if (j < p[depth - 1]->sz && !Compare()(vkey, p[depth - 1]->keyvalue[j])) {
                delete[]p;
                delete[]pp;
                delete[]pos;
                return 0;
            }
            node *&x = p[depth - 1];
            if (!j) {
                for (i = depth - 2; i >= 0; --i)
                    if (pp[i] && equal(x->keyvalue[0], p[i]->keyvalue[pp[i] - 1])) {
                        p[i]->keyvalue[pp[i] - 1] = vkey;
                        file->save(pos[i]);
                        break;
                    }
            }
            if (x->sz < degree - 1) {
                for (i = x->sz; i > j; --i)x->keyvalue[i] = x->keyvalue[i - 1], x->val[i] = x->val[i - 1];
                x->keyvalue[j] = vkey;
                x->val[j] = vt;
                ++x->sz;
                file->save(pos[depth - 1]);
            } else {
                T tmpv[degree];
                Key tmpk[degree];
                auto lnk = file->newspace();
                node *y = lnk.first;
                for (i = 0; i < j; ++i)tmpv[i] = x->val[i], tmpk[i] = x->keyvalue[i];
                tmpv[j] = vt;
                tmpk[j] = vkey;
                for (i = j + 1; i < degree; ++i)tmpv[i] = x->val[i - 1], tmpk[i] = x->keyvalue[i - 1];
                y->nxt = x->nxt;
                x->sz = degree >> 1;
                for (i = 0; i < x->sz; ++i)x->val[i] = tmpv[i], x->keyvalue[i] = tmpk[i];
                x->nxt = lnk.second;
                for (i = x->sz; i < degree; ++i)y->val[i - x->sz] = tmpv[i], y->keyvalue[i - x->sz] = tmpk[i];
                y->sz = degree - x->sz;
                file->save(lnk.second);
                file->save(pos[depth - 1]);
                insertnonleaf(y->keyvalue[0], depth - 2, p, pp, pos, lnk.second);
            }
            delete[]p;
            delete[]pp;
            delete[]pos;
            ++siz;
            return 1;
        }